

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int DLevelScript::CountPlayers(void)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  uint5 uVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  
  auVar1[0xc] = SUB41(playeringame._0_4_,3);
  auVar1._0_12_ = ZEXT712(0);
  uVar6 = CONCAT32(auVar1._10_3_,(ushort)SUB41(playeringame._0_4_,2));
  auVar8._5_8_ = 0;
  auVar8._0_5_ = uVar6;
  uVar5 = (ulong)(ushort)playeringame._4_4_ & 0xffffffffffff00ff;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar5;
  auVar2[0xc] = SUB41(playeringame._4_4_,3);
  auVar3[8] = SUB41(playeringame._4_4_,2);
  auVar3._0_8_ = uVar5;
  auVar3[9] = 0;
  auVar3._10_3_ = auVar2._10_3_;
  auVar7._5_8_ = 0;
  auVar7._0_5_ = auVar3._8_5_;
  auVar4[4] = SUB41(playeringame._4_4_,1);
  auVar4._0_4_ = (int)uVar5;
  auVar4[5] = 0;
  auVar4._6_7_ = SUB137(auVar7 << 0x40,6);
  return (uint)(uint3)(auVar2._10_3_ >> 0x10) + (uint)(uint3)(auVar1._10_3_ >> 0x10) +
         auVar4._4_4_ + (int)CONCAT72(SUB137(auVar8 << 0x40,6),(ushort)SUB41(playeringame._0_4_,1))
         + auVar3._8_4_ + (int)uVar6 + (int)uVar5 + (playeringame._0_4_ & 0xff);
}

Assistant:

int DLevelScript::CountPlayers ()
{
	int count = 0, i;

	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i])
			count++;

	return count;
}